

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

int64_t encoder_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h)

{
  int diff;
  int64_t sse;
  int j;
  int i;
  int h_local;
  int w_local;
  int b_stride_local;
  uint8_t *b_local;
  int a_stride_local;
  uint8_t *a_local;
  
  sse = 0;
  b_local = b;
  a_local = a;
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      sse = (int)(((uint)a_local[j] - (uint)b_local[j]) * ((uint)a_local[j] - (uint)b_local[j])) +
            sse;
    }
    a_local = a_local + a_stride;
    b_local = b_local + b_stride;
  }
  return sse;
}

Assistant:

static int64_t encoder_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                           int b_stride, int w, int h) {
  int i, j;
  int64_t sse = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      const int diff = a[j] - b[j];
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}